

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::_PathArcToN
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImVector<ImVec2> *this_00;
  float fVar4;
  ImVec2 local_40;
  float local_38;
  
  this_00 = &this->_Path;
  if (0.0 < radius) {
    ImVector<ImVec2>::reserve(this_00,num_segments + this_00->Size + 1);
    for (iVar3 = 0; iVar3 <= num_segments; iVar3 = iVar3 + 1) {
      fVar4 = ((float)iVar3 / (float)num_segments) * (a_max - a_min) + a_min;
      fVar1 = center->x;
      local_38 = cosf(fVar4);
      fVar2 = center->y;
      fVar4 = sinf(fVar4);
      local_40.y = fVar4 * radius + fVar2;
      local_40.x = local_38 * radius + fVar1;
      ImVector<ImVec2>::push_back(this_00,&local_40);
    }
    return;
  }
  ImVector<ImVec2>::push_back(this_00,center);
  return;
}

Assistant:

void ImDrawList::_PathArcToN(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}